

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

void __thiscall
Hospital::Remove_Nurse
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  pointer pNVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pNVar3 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      Nurse::nurse_all_ino_getter_abi_cxx11_
                (&local_48,(Nurse *)((long)&(pNVar3->super_Human).Id._M_dataplus._M_p + lVar5));
      __n = (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if (__n == id->_M_string_length) {
        if (__n == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
LAB_0011e171:
          std::vector<Nurse,_std::allocator<Nurse>_>::_M_erase
                    (All_Of_Nurses,
                     (Nurse *)((long)&(((All_Of_Nurses->
                                        super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                                        super__Vector_impl_data._M_start)->super_Human).Id.
                                      _M_dataplus + lVar5));
          return;
        }
        iVar1 = bcmp(((local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                     (id->_M_dataplus)._M_p,__n);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        if (iVar1 == 0) goto LAB_0011e171;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      uVar4 = uVar4 + 1;
      pNVar3 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar3 >> 3) * -0x7d05f417d05f417d;
      lVar5 = lVar5 + 0x158;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return;
}

Assistant:

void Hospital :: Remove_Nurse(vector<Nurse>& All_Of_Nurses , string id){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if(All_Of_Nurses[i].nurse_all_ino_getter()[0] == id){
            All_Of_Nurses.erase(All_Of_Nurses.begin()+i);
            ///remove from files
            break;
        }
    }
}